

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRVariable * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::allocate<unsigned_int&,spv::StorageClass>
          (ObjectPool<spirv_cross::SPIRVariable> *this,uint *p,StorageClass *p_1)

{
  StorageClass SVar1;
  size_t sVar2;
  _Tuple_impl<0UL,_spirv_cross::SPIRVariable_*,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
  _Var3;
  ulong uVar4;
  SPIRVariable *pSVar5;
  uint uVar6;
  _Head_base<0UL,_spirv_cross::SPIRVariable_*,_false> _Var7;
  
  if ((this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size == 0) {
    uVar6 = this->start_object_count <<
            ((byte)(this->memory).
                   super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
                   .buffer_size & 0x1f);
    uVar4 = (ulong)uVar6;
    _Var3.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>)malloc(uVar4 * 0xb0);
    if (_Var3.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl !=
        (SPIRVariable *)0x0) {
      _Var7._M_head_impl =
           (SPIRVariable *)
           _Var3.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl;
      if (uVar6 != 0) {
        do {
          SmallVector<spirv_cross::SPIRVariable_*,_0UL>::reserve
                    (&this->vacants,
                     (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size + 1);
          sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
          (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar2] =
               _Var7._M_head_impl;
          (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size = sVar2 + 1;
          uVar4 = uVar4 - 1;
          _Var7._M_head_impl = _Var7._M_head_impl + 1;
        } while (uVar4 != 0);
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
                .buffer_size + 1);
      sVar2 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
      .ptr[sVar2]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRVariable_*,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false> =
           _Var3.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
      .buffer_size = sVar2 + 1;
      if (_Var3.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl !=
          (SPIRVariable *)0x0) goto LAB_00288b8e;
    }
    pSVar5 = (SPIRVariable *)0x0;
  }
  else {
LAB_00288b8e:
    sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
    pSVar5 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar2 - 1];
    if (sVar2 != 0) {
      SmallVector<spirv_cross::SPIRVariable_*,_0UL>::resize(&this->vacants,sVar2 - 1);
    }
    uVar6 = *p;
    SVar1 = *p_1;
    (pSVar5->super_IVariant).self.id = 0;
    (pSVar5->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRVariable_003fd5b0;
    *(uint *)&(pSVar5->super_IVariant).field_0xc = uVar6;
    pSVar5->storage = SVar1;
    pSVar5->decoration = 0;
    pSVar5->initializer = 0;
    *(undefined8 *)&pSVar5->basevariable = 0;
    *(undefined8 *)((long)&(pSVar5->dereference_chain).super_VectorView<unsigned_int>.ptr + 4) = 0;
    *(undefined8 *)
     ((long)&(pSVar5->dereference_chain).super_VectorView<unsigned_int>.buffer_size + 4) = 0;
    *(undefined4 *)((long)&(pSVar5->dereference_chain).buffer_capacity + 4) = 0;
    (pSVar5->dereference_chain).super_VectorView<unsigned_int>.ptr =
         (uint *)&(pSVar5->dereference_chain).stack_storage;
    (pSVar5->dereference_chain).buffer_capacity = 8;
    pSVar5->compat_builtin = false;
    pSVar5->statically_assigned = false;
    *(undefined8 *)&pSVar5->static_expression = 0;
    *(undefined8 *)
     ((long)&(pSVar5->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr
     + 4) = 0;
    (pSVar5->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size =
         0;
    (pSVar5->dependees).buffer_capacity = 0;
    (pSVar5->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
         (TypedID<(spirv_cross::Types)0> *)&(pSVar5->dependees).stack_storage;
    (pSVar5->dependees).buffer_capacity = 8;
    pSVar5->parameter = (Parameter *)0x0;
    *(undefined8 *)((long)&pSVar5->remapped_components + 2) = 0;
    pSVar5->deferred_declaration = false;
    pSVar5->phi_variable = false;
    pSVar5->allocate_temporary_copy = false;
    pSVar5->remapped_variable = false;
    pSVar5->remapped_components = 0;
  }
  return pSVar5;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}